

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineShape.cpp
# Opt level: O3

void __thiscall
chrono::ChLineShape::ChLineShape(ChLineShape *this,shared_ptr<chrono::geometry::ChLine> *mline)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  ChVisualShape::ChVisualShape(&this->super_ChVisualShape);
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChLineShape_00b41e18;
  p_Var2 = (mline->super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  p_Var1 = (mline->super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->gline).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mline->super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->gline).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->npoints = 200;
  return;
}

Assistant:

ChLineShape::ChLineShape(std::shared_ptr<geometry::ChLine>& mline) : npoints(200), gline(mline) {}